

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall
GlobOpt::PropagateIntRangeForNot
          (GlobOpt *this,int32 minimum,int32 maximum,int32 *pNewMin,int32 *pNewMax)

{
  uint uVar1;
  uint uVar2;
  
  *pNewMin = ~minimum;
  *pNewMax = ~minimum;
  uVar2 = ~maximum;
  uVar1 = *pNewMin;
  if ((int)uVar2 <= *pNewMin) {
    uVar1 = uVar2;
  }
  *pNewMin = uVar1;
  if ((int)uVar2 < *pNewMax) {
    uVar2 = *pNewMax;
  }
  *pNewMax = uVar2;
  return;
}

Assistant:

void
GlobOpt::PropagateIntRangeForNot(int32 minimum, int32 maximum, int32 *pNewMin, int32* pNewMax)
{
    int32 tmp;
    Int32Math::Not(minimum, pNewMin);
    *pNewMax = *pNewMin;
    Int32Math::Not(maximum, &tmp);
    *pNewMin = min(*pNewMin, tmp);
    *pNewMax = max(*pNewMax, tmp);
}